

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_spiff_header.cpp
# Opt level: O2

charls_jpegls_errc
charls_validate_spiff_header(charls_spiff_header *spiff_header,charls_frame_info *frame_info)

{
  int iVar1;
  charls_jpegls_errc cVar2;
  
  if (((((spiff_header->compression_type == jpeg_ls) && (spiff_header->profile_id == none)) &&
       (spiff_header->resolution_units < (dots_per_centimeter|dots_per_inch))) &&
      ((spiff_header->horizontal_resolution != 0 && (spiff_header->vertical_resolution != 0)))) &&
     (iVar1 = spiff_header->component_count, iVar1 == frame_info->component_count)) {
    switch(spiff_header->color_space) {
    case ycbcr_itu_bt_709_video:
    case ycbcr_itu_bt_601_1_rgb:
    case ycbcr_itu_bt_601_1_video:
    case photo_ycc:
    case rgb:
    case cmy:
    case cie_lab:
      if (iVar1 != 3) {
        return invalid_spiff_header;
      }
      break;
    case none:
      break;
    default:
      goto switchD_00123a40_caseD_5;
    case grayscale:
      if (iVar1 != 1) {
        return invalid_spiff_header;
      }
      break;
    case cmyk:
    case ycck:
      if (iVar1 != 4) {
        return invalid_spiff_header;
      }
    }
    if ((spiff_header->bits_per_sample == frame_info->bits_per_sample) &&
       (spiff_header->height == frame_info->height)) {
      cVar2 = invalid_spiff_header;
      if (spiff_header->width == frame_info->width) {
        cVar2 = OK;
      }
      return cVar2;
    }
  }
switchD_00123a40_caseD_5:
  return invalid_spiff_header;
}

Assistant:

bool is_valid_spiff_header(const spiff_header& header, const charls::frame_info& frame_info) noexcept
{
    if (header.compression_type != spiff_compression_type::jpeg_ls)
        return false;

    if (header.profile_id != spiff_profile_id::none)
        return false;

    if (!is_valid_resolution_units(header.resolution_units))
        return false;

    if (header.horizontal_resolution == 0 || header.vertical_resolution == 0)
        return false;

    if (header.component_count != frame_info.component_count)
        return false;

    if (!is_valid_color_space(header.color_space, header.component_count))
        return false;

    if (header.bits_per_sample != frame_info.bits_per_sample)
        return false;

    if (header.height != frame_info.height)
        return false;

    if (header.width != frame_info.width)
        return false;

    return true;
}